

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void rsg::anon_unknown_0::computeRandomValueRangeForInfElements
               (GeneratorState *state,ValueRangeAccess valueRange)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  Type TVar4;
  int iVar5;
  Scalar *pSVar6;
  int *piVar7;
  float *pfVar8;
  Exception *this;
  float fVar9;
  bool local_1ed;
  bool local_1cd;
  allocator<char> local_1a1;
  string local_1a0;
  ConstStridedValueAccess<1> local_180;
  ConstStridedValueAccess<1> local_170;
  ConstStridedValueAccess<1> local_160;
  ConstStridedValueAccess<1> local_150;
  float local_140;
  float local_13c;
  float maxVal_1;
  float minVal_1;
  int minStep;
  int rangeLen_1;
  float minFloatVal;
  int maxSteps;
  float step;
  ConstStridedValueAccess<1> local_110;
  Scalar local_fc;
  ConstStridedValueAccess<1> local_f8;
  ConstStridedValueAccess<1> local_e8;
  int local_d4;
  undefined1 auStack_d0 [4];
  int ndx_1;
  ConstStridedValueAccess<1> local_c0;
  ConstStridedValueAccess<1> local_b0;
  ConstStridedValueAccess<1> local_a0;
  int local_8c;
  int local_88;
  int maxVal;
  int minVal;
  int rangeLen;
  int maxRangeLen;
  int maxIntVal;
  int minIntVal;
  ConstStridedValueAccess<1> local_60;
  Scalar local_4c;
  ConstStridedValueAccess<1> local_48;
  ConstStridedValueAccess<1> local_38;
  int local_24;
  Random *pRStack_20;
  int ndx;
  Random *rnd;
  VariableType *type;
  GeneratorState *state_local;
  
  type = (VariableType *)state;
  rnd = (Random *)ConstValueRangeAccess::getType(&valueRange.super_ConstValueRangeAccess);
  pRStack_20 = GeneratorState::getRandom((GeneratorState *)type);
  TVar4 = VariableType::getBaseType((VariableType *)rnd);
  if (TVar4 == TYPE_FLOAT) {
    for (local_d4 = 0; iVar2 = local_d4, iVar5 = VariableType::getNumElements((VariableType *)rnd),
        iVar2 < iVar5; local_d4 = local_d4 + 1) {
      local_f8 = (ConstStridedValueAccess<1>)
                 ValueRangeAccess::getMin
                           ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
      local_e8 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_f8,local_d4);
      pSVar6 = StridedValueAccess<1>::asScalar((StridedValueAccess<1> *)&local_e8);
      local_fc = Scalar::min<float>();
      bVar3 = Scalar::operator!=((Scalar *)&pSVar6->boolVal,local_fc);
      local_1ed = true;
      if (!bVar3) {
        _step = (ConstStridedValueAccess<1>)
                ValueRangeAccess::getMax
                          ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
        local_110 = (ConstStridedValueAccess<1>)
                    StridedValueAccess<1>::component((StridedValueAccess<1> *)&step,local_d4);
        pSVar6 = StridedValueAccess<1>::asScalar((StridedValueAccess<1> *)&local_110);
        maxSteps = (int)Scalar::max<float>();
        local_1ed = Scalar::operator!=((Scalar *)&pSVar6->boolVal,(Scalar)maxSteps);
      }
      if (local_1ed == false) {
        minFloatVal = 0.1;
        rangeLen_1 = 0x140;
        minStep = -0x3e800000;
        minVal_1 = (float)de::Random::getInt(pRStack_20,0,0x140);
        maxVal_1 = (float)de::Random::getInt(pRStack_20,0,0x140 - (int)minVal_1);
        fVar9 = (float)(int)maxVal_1 * 0.1 + -16.0;
        local_140 = (float)(int)minVal_1 * 0.1 + fVar9;
        local_13c = fVar9;
        local_160 = (ConstStridedValueAccess<1>)
                    ValueRangeAccess::getMin
                              ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
        local_150 = (ConstStridedValueAccess<1>)
                    StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_160,local_d4);
        pfVar8 = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_150);
        fVar1 = local_140;
        *pfVar8 = fVar9;
        local_180 = (ConstStridedValueAccess<1>)
                    ValueRangeAccess::getMax
                              ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
        local_170 = (ConstStridedValueAccess<1>)
                    StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_180,local_d4);
        pfVar8 = StridedValueAccess<1>::asFloat((StridedValueAccess<1> *)&local_170);
        *pfVar8 = fVar1;
      }
    }
  }
  else if (TVar4 == TYPE_INT) {
    for (local_24 = 0; iVar2 = local_24, iVar5 = VariableType::getNumElements((VariableType *)rnd),
        iVar2 < iVar5; local_24 = local_24 + 1) {
      local_48 = (ConstStridedValueAccess<1>)
                 ValueRangeAccess::getMin
                           ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
      local_38 = (ConstStridedValueAccess<1>)
                 StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_48,local_24);
      pSVar6 = StridedValueAccess<1>::asScalar((StridedValueAccess<1> *)&local_38);
      local_4c = Scalar::min<int>();
      bVar3 = Scalar::operator!=((Scalar *)&pSVar6->boolVal,local_4c);
      local_1cd = true;
      if (!bVar3) {
        _minIntVal = (ConstStridedValueAccess<1>)
                     ValueRangeAccess::getMax
                               ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
        local_60 = (ConstStridedValueAccess<1>)
                   StridedValueAccess<1>::component((StridedValueAccess<1> *)&minIntVal,local_24);
        pSVar6 = StridedValueAccess<1>::asScalar((StridedValueAccess<1> *)&local_60);
        maxIntVal = (int)Scalar::max<int>();
        local_1cd = Scalar::operator!=((Scalar *)&pSVar6->boolVal,(Scalar)maxIntVal);
      }
      if (local_1cd == false) {
        maxRangeLen = -0x10;
        rangeLen = 0x10;
        minVal = 0x20;
        maxVal = de::Random::getInt(pRStack_20,0,0x20);
        iVar5 = de::Random::getInt(pRStack_20,0,0x20 - maxVal);
        iVar5 = iVar5 + -0x10;
        local_8c = iVar5 + maxVal;
        local_88 = iVar5;
        local_b0 = (ConstStridedValueAccess<1>)
                   ValueRangeAccess::getMin
                             ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
        local_a0 = (ConstStridedValueAccess<1>)
                   StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_b0,local_24);
        piVar7 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_a0);
        iVar2 = local_8c;
        *piVar7 = iVar5;
        _auStack_d0 = (ConstStridedValueAccess<1>)
                      ValueRangeAccess::getMax
                                ((ValueRangeAccess *)&valueRange.super_ConstValueRangeAccess);
        local_c0 = (ConstStridedValueAccess<1>)
                   StridedValueAccess<1>::component((StridedValueAccess<1> *)auStack_d0,local_24);
        piVar7 = StridedValueAccess<1>::asInt((StridedValueAccess<1> *)&local_c0);
        *piVar7 = iVar2;
      }
    }
  }
  else if (TVar4 != TYPE_BOOL) {
    this = (Exception *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"computeRandomValueRangeForInfElements(): unsupported type",
               &local_1a1);
    Exception::Exception(this,&local_1a0);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void computeRandomValueRangeForInfElements (GeneratorState& state, ValueRangeAccess valueRange)
{
	const VariableType&	type	= valueRange.getType();
	de::Random&		rnd		= state.getRandom();

	switch (type.getBaseType())
	{
		case VariableType::TYPE_BOOL:
			// No need to handle bool as it will be false, true
			break;

		case VariableType::TYPE_INT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				if (valueRange.getMin().component(ndx).asScalar() != Scalar::min<int>() ||
					valueRange.getMax().component(ndx).asScalar() != Scalar::max<int>())
					continue;

				const int minIntVal		= -16;
				const int maxIntVal		=  16;
				const int maxRangeLen	= maxIntVal - minIntVal;

				int rangeLen	= rnd.getInt(0, maxRangeLen);
				int minVal		= minIntVal + rnd.getInt(0, maxRangeLen-rangeLen);
				int maxVal		= minVal + rangeLen;

				valueRange.getMin().component(ndx).asInt() = minVal;
				valueRange.getMax().component(ndx).asInt() = maxVal;
			}
			break;

		case VariableType::TYPE_FLOAT:
			for (int ndx = 0; ndx < type.getNumElements(); ndx++)
			{
				if (valueRange.getMin().component(ndx).asScalar() != Scalar::min<float>() ||
					valueRange.getMax().component(ndx).asScalar() != Scalar::max<float>())
					continue;

				const float step			= 0.1f;
				const int	maxSteps		= 320;
				const float minFloatVal		= -16.0f;

				int rangeLen	= rnd.getInt(0, maxSteps);
				int minStep		= rnd.getInt(0, maxSteps-rangeLen);

				float minVal	= minFloatVal + step*(float)minStep;
				float maxVal	= minVal + step*(float)rangeLen;

				valueRange.getMin().component(ndx).asFloat() = minVal;
				valueRange.getMax().component(ndx).asFloat() = maxVal;
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("computeRandomValueRangeForInfElements(): unsupported type");
	}
}